

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_.cpp
# Opt level: O0

void __thiscall vector_<char>::resize(vector_<char> *this)

{
  char cVar1;
  type pcVar2;
  int local_1c;
  int i;
  __array temp;
  vector_<char> *this_local;
  
  this->capacity = this->capacity << 1;
  temp._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)this;
  std::make_unique<char[]>((size_t)&stack0xffffffffffffffe8);
  for (local_1c = 0; (ulong)(long)local_1c < this->_size; local_1c = local_1c + 1) {
    pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                       (&this->arr,(long)local_1c);
    cVar1 = *pcVar2;
    pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                       ((unique_ptr<char[],_std::default_delete<char[]>_> *)&stack0xffffffffffffffe8
                        ,(long)local_1c);
    *pcVar2 = cVar1;
  }
  std::unique_ptr<char[],_std::default_delete<char[]>_>::operator=
            (&this->arr,(unique_ptr<char[],_std::default_delete<char[]>_> *)&stack0xffffffffffffffe8
            );
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void resize() {
        capacity *= 2;
        auto temp = make_unique<T[]>(capacity);
        for (int i = 0; i < _size; i++) {
            temp[i] = arr[i];
        }
        arr = std::move(temp);
    }